

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_address.cpp
# Opt level: O3

void __thiscall
zmq::tcp_address_t::tcp_address_t(tcp_address_t *this,sockaddr *sa_,socklen_t sa_len_)

{
  undefined8 uVar1;
  undefined4 uVar2;
  in_addr_t iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  this->_has_src_addr = false;
  if ((sa_ == (sockaddr *)0x0) || (sa_len_ == 0)) {
    zmq::tcp_address_t();
  }
  *(undefined8 *)((long)&this->_source_address + 4) = 0;
  *(undefined8 *)((long)&this->_source_address + 0xc) = 0;
  *(undefined8 *)((long)&this->_address + 0x10) = 0;
  *(undefined8 *)((long)&this->_address + 0x18) = 0;
  *(undefined8 *)&this->_address = 0;
  *(undefined8 *)((long)&this->_address + 8) = 0;
  *(undefined8 *)((long)&this->_source_address + 0x14) = 0;
  if (sa_len_ < 0x10 || sa_->sa_family != 2) {
    if (sa_len_ < 0x1c || sa_->sa_family != 10) {
      return;
    }
    uVar2._0_2_ = sa_->sa_family;
    uVar2._2_1_ = sa_->sa_data[0];
    uVar2._3_1_ = sa_->sa_data[1];
    iVar3 = *(in_addr_t *)(sa_->sa_data + 2);
    uVar4 = *(undefined4 *)(sa_->sa_data + 6);
    uVar5 = *(undefined4 *)(sa_->sa_data + 10);
    uVar1 = *(undefined8 *)(sa_[1].sa_data + 2);
    *(undefined8 *)((long)&this->_address + 0xc) = *(undefined8 *)(sa_->sa_data + 10);
    *(undefined8 *)((long)&this->_address + 0x14) = uVar1;
  }
  else {
    uVar2._0_2_ = sa_->sa_family;
    uVar2._2_1_ = sa_->sa_data[0];
    uVar2._3_1_ = sa_->sa_data[1];
    iVar3 = *(in_addr_t *)(sa_->sa_data + 2);
    uVar4 = *(undefined4 *)(sa_->sa_data + 6);
    uVar5 = *(undefined4 *)(sa_->sa_data + 10);
  }
  *(undefined4 *)&this->_address = uVar2;
  (this->_address).ipv4.sin_addr.s_addr = iVar3;
  *(undefined4 *)((long)&this->_address + 8) = uVar4;
  *(undefined4 *)((long)&this->_address + 0xc) = uVar5;
  return;
}

Assistant:

zmq::tcp_address_t::tcp_address_t (const sockaddr *sa_, socklen_t sa_len_) :
    _has_src_addr (false)
{
    zmq_assert (sa_ && sa_len_ > 0);

    memset (&_address, 0, sizeof (_address));
    memset (&_source_address, 0, sizeof (_source_address));
    if (sa_->sa_family == AF_INET
        && sa_len_ >= static_cast<socklen_t> (sizeof (_address.ipv4)))
        memcpy (&_address.ipv4, sa_, sizeof (_address.ipv4));
    else if (sa_->sa_family == AF_INET6
             && sa_len_ >= static_cast<socklen_t> (sizeof (_address.ipv6)))
        memcpy (&_address.ipv6, sa_, sizeof (_address.ipv6));
}